

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_entities(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  xmlDocPtr pxVar9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  xmlChar *pxVar12;
  xmlEntityPtr pxVar13;
  xmlBufferPtr pxVar14;
  xmlDocPtr pxVar15;
  long lVar16;
  uint uVar17;
  int nr;
  int nr_00;
  int extraout_EDX;
  int nr_01;
  int nr_02;
  int nr_03;
  int n_buf;
  uint uVar18;
  int test_ret;
  uint uVar19;
  xmlDocPtr in_RSI;
  bool bVar20;
  uint uVar21;
  int n_doc;
  uint uVar22;
  undefined1 auVar23 [12];
  int local_58;
  int local_54;
  int local_4c;
  int test_ret_1;
  int local_38;
  uint local_34;
  
  if (quiet == '\0') {
    puts("Testing entities : 13 of 17 functions ...");
  }
  local_38 = 0;
  for (uVar19 = 0; uVar19 != 4; uVar19 = uVar19 + 1) {
    for (uVar22 = 0; uVar22 != 5; uVar22 = uVar22 + 1) {
      for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
        for (uVar1 = 0; uVar1 != 5; uVar1 = uVar1 + 1) {
          for (uVar17 = 0; uVar17 != 5; uVar17 = uVar17 + 1) {
            for (uVar21 = 0; iVar4 = (int)in_RSI, uVar21 != 5; uVar21 = uVar21 + 1) {
              iVar2 = xmlMemBlocks();
              pxVar9 = gen_xmlDocPtr(uVar19,iVar4);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar22,iVar4);
              iVar3 = gen_int(uVar18,iVar4);
              pxVar10 = gen_const_xmlChar_ptr(uVar1,iVar4);
              pxVar11 = gen_const_xmlChar_ptr(uVar17,iVar4);
              pxVar12 = gen_const_xmlChar_ptr(uVar21,iVar4);
              pxVar13 = (xmlEntityPtr)xmlAddDocEntity(pxVar9,in_RSI,iVar3,pxVar10,pxVar11,pxVar12);
              desret_xmlEntityPtr(pxVar13);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar9,in_RSI,nr);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar2 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDocEntity",(ulong)(uint)(iVar4 - iVar2));
                local_38 = local_38 + 1;
                printf(" %d",(ulong)uVar19);
                printf(" %d",(ulong)uVar22);
                printf(" %d",(ulong)uVar18);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar17);
                in_RSI = (xmlDocPtr)(ulong)uVar21;
                printf(" %d");
                putchar(10);
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_4c = 0;
  for (uVar19 = 0; uVar19 != 4; uVar19 = uVar19 + 1) {
    for (uVar22 = 0; uVar22 != 5; uVar22 = uVar22 + 1) {
      for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
        for (uVar1 = 0; uVar1 != 5; uVar1 = uVar1 + 1) {
          for (uVar17 = 0; uVar17 != 5; uVar17 = uVar17 + 1) {
            for (uVar21 = 0; iVar4 = (int)in_RSI, uVar21 != 5; uVar21 = uVar21 + 1) {
              iVar2 = xmlMemBlocks();
              pxVar9 = gen_xmlDocPtr(uVar19,iVar4);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar22,iVar4);
              iVar3 = gen_int(uVar18,iVar4);
              pxVar10 = gen_const_xmlChar_ptr(uVar1,iVar4);
              pxVar11 = gen_const_xmlChar_ptr(uVar17,iVar4);
              pxVar12 = gen_const_xmlChar_ptr(uVar21,iVar4);
              pxVar13 = (xmlEntityPtr)xmlAddDtdEntity(pxVar9,in_RSI,iVar3,pxVar10,pxVar11,pxVar12);
              desret_xmlEntityPtr(pxVar13);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar9,in_RSI,nr_00);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar2 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDtdEntity",(ulong)(uint)(iVar4 - iVar2));
                local_4c = local_4c + 1;
                printf(" %d",(ulong)uVar19);
                printf(" %d",(ulong)uVar22);
                printf(" %d",(ulong)uVar18);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar17);
                in_RSI = (xmlDocPtr)(ulong)uVar21;
                printf(" %d");
                putchar(10);
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlCleanupPredefinedEntities();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  iVar3 = 0;
  if (iVar4 != iVar2) {
    iVar5 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)(ulong)(uint)(iVar5 - iVar4);
    printf("Leak of %d blocks found in xmlCleanupPredefinedEntities");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  do {
    if (iVar3 == 3) {
      function_tests = function_tests + 1;
      iVar3 = 0;
      test_ret_1 = 0;
      do {
        if (iVar3 == 3) {
          function_tests = function_tests + 1;
          local_58 = 0;
          for (uVar19 = 0; uVar19 != 4; uVar19 = uVar19 + 1) {
            pxVar9 = (xmlDocPtr)0x0;
            while( true ) {
              iVar3 = (int)in_RSI;
              iVar7 = (int)pxVar9;
              if (iVar7 == 5) break;
              iVar6 = xmlMemBlocks();
              pxVar15 = gen_xmlDocPtr(uVar19,iVar3);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar7,iVar3);
              auVar23 = xmlEncodeEntitiesReentrant(pxVar15);
              iVar3 = auVar23._8_4_;
              if (auVar23._0_8_ != 0) {
                (*_xmlFree)(auVar23._0_8_);
                iVar3 = extraout_EDX;
              }
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar15,in_RSI,iVar3);
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar6 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlEncodeEntitiesReentrant",
                       (ulong)(uint)(iVar3 - iVar6));
                local_58 = local_58 + 1;
                printf(" %d",(ulong)uVar19);
                printf(" %d");
                putchar(10);
                in_RSI = pxVar9;
              }
              pxVar9 = (xmlDocPtr)(ulong)(iVar7 + 1);
            }
          }
          function_tests = function_tests + 1;
          bVar20 = true;
          local_54 = 0;
          while (bVar20) {
            for (uVar19 = 0; iVar3 = (int)in_RSI, uVar19 != 5; uVar19 = uVar19 + 1) {
              iVar7 = xmlMemBlocks();
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar19,iVar3);
              lVar16 = xmlEncodeSpecialChars(0);
              if (lVar16 != 0) {
                (*_xmlFree)(lVar16);
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar7 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlEncodeSpecialChars",
                       (ulong)(uint)(iVar3 - iVar7));
                local_54 = local_54 + 1;
                printf(" %d",0);
                in_RSI = (xmlDocPtr)(ulong)uVar19;
                printf(" %d");
                putchar(10);
              }
            }
            bVar20 = false;
          }
          iVar4 = local_4c + local_38 + (uint)(iVar4 != iVar2) + iVar5 + test_ret_1;
          function_tests = function_tests + 1;
          bVar20 = true;
          test_ret_1 = 0;
          while (bVar20) {
            for (uVar19 = 0; iVar2 = (int)in_RSI, uVar19 != 5; uVar19 = uVar19 + 1) {
              iVar3 = xmlMemBlocks();
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar19,iVar2);
              pxVar13 = (xmlEntityPtr)xmlGetDocEntity(0);
              desret_xmlEntityPtr(pxVar13);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar2 = xmlMemBlocks();
              if (iVar3 != iVar2) {
                iVar2 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlGetDocEntity",(ulong)(uint)(iVar2 - iVar3));
                test_ret_1 = test_ret_1 + 1;
                printf(" %d",0);
                in_RSI = (xmlDocPtr)(ulong)uVar19;
                printf(" %d");
                putchar(10);
              }
            }
            bVar20 = false;
          }
          function_tests = function_tests + 1;
          iVar2 = 0;
          for (uVar19 = 0; uVar19 != 4; uVar19 = uVar19 + 1) {
            pxVar9 = (xmlDocPtr)0x0;
            while( true ) {
              iVar3 = (int)in_RSI;
              iVar5 = (int)pxVar9;
              if (iVar5 == 5) break;
              iVar7 = xmlMemBlocks();
              pxVar15 = gen_xmlDocPtr(uVar19,iVar3);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar5,iVar3);
              pxVar13 = (xmlEntityPtr)xmlGetDtdEntity(pxVar15);
              desret_xmlEntityPtr(pxVar13);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar15,in_RSI,nr_01);
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar7 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlGetDtdEntity",(ulong)(uint)(iVar3 - iVar7));
                iVar2 = iVar2 + 1;
                printf(" %d",(ulong)uVar19);
                printf(" %d");
                putchar(10);
                in_RSI = pxVar9;
              }
              pxVar9 = (xmlDocPtr)(ulong)(iVar5 + 1);
            }
          }
          function_tests = function_tests + 1;
          iVar3 = 0;
          for (uVar19 = 0; uVar19 != 4; uVar19 = uVar19 + 1) {
            pxVar9 = (xmlDocPtr)0x0;
            while( true ) {
              iVar5 = (int)in_RSI;
              iVar7 = (int)pxVar9;
              if (iVar7 == 5) break;
              iVar6 = xmlMemBlocks();
              pxVar15 = gen_xmlDocPtr(uVar19,iVar5);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar7,iVar5);
              pxVar13 = (xmlEntityPtr)xmlGetParameterEntity(pxVar15);
              desret_xmlEntityPtr(pxVar13);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar15,in_RSI,nr_02);
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar6 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlGetParameterEntity",
                       (ulong)(uint)(iVar5 - iVar6));
                iVar3 = iVar3 + 1;
                printf(" %d",(ulong)uVar19);
                printf(" %d");
                putchar(10);
                in_RSI = pxVar9;
              }
              pxVar9 = (xmlDocPtr)(ulong)(iVar7 + 1);
            }
          }
          function_tests = function_tests + 1;
          iVar5 = 0;
          for (uVar19 = 0; uVar19 != 5; uVar19 = uVar19 + 1) {
            iVar7 = xmlMemBlocks();
            pxVar10 = gen_const_xmlChar_ptr(uVar19,(int)in_RSI);
            pxVar13 = (xmlEntityPtr)xmlGetPredefinedEntity(pxVar10);
            desret_xmlEntityPtr(pxVar13);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar7 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlGetPredefinedEntity",
                     (ulong)(uint)(iVar6 - iVar7));
              iVar5 = iVar5 + 1;
              in_RSI = (xmlDocPtr)(ulong)uVar19;
              printf(" %d");
              putchar(10);
            }
          }
          function_tests = function_tests + 1;
          iVar7 = xmlMemBlocks();
          xmlInitializePredefinedEntities();
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar7 != iVar6) {
            iVar8 = xmlMemBlocks();
            in_RSI = (xmlDocPtr)(ulong)(uint)(iVar8 - iVar7);
            printf("Leak of %d blocks found in xmlInitializePredefinedEntities");
            putchar(10);
          }
          local_34 = (uint)(iVar7 != iVar6);
          function_tests = function_tests + 1;
          local_38 = 0;
          for (uVar19 = 0; uVar19 != 4; uVar19 = uVar19 + 1) {
            for (uVar22 = 0; uVar22 != 5; uVar22 = uVar22 + 1) {
              for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
                for (uVar1 = 0; uVar1 != 5; uVar1 = uVar1 + 1) {
                  for (uVar17 = 0; uVar17 != 5; uVar17 = uVar17 + 1) {
                    for (uVar21 = 0; iVar7 = (int)in_RSI, uVar21 != 5; uVar21 = uVar21 + 1) {
                      iVar6 = xmlMemBlocks();
                      pxVar9 = gen_xmlDocPtr(uVar19,iVar7);
                      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar22,iVar7);
                      iVar8 = gen_int(uVar18,iVar7);
                      pxVar10 = gen_const_xmlChar_ptr(uVar1,iVar7);
                      pxVar11 = gen_const_xmlChar_ptr(uVar17,iVar7);
                      pxVar12 = gen_const_xmlChar_ptr(uVar21,iVar7);
                      pxVar13 = (xmlEntityPtr)
                                xmlNewEntity(pxVar9,in_RSI,iVar8,pxVar10,pxVar11,pxVar12);
                      desret_xmlEntityPtr(pxVar13);
                      call_tests = call_tests + 1;
                      des_xmlDocPtr((int)pxVar9,in_RSI,nr_03);
                      xmlResetLastError();
                      iVar7 = xmlMemBlocks();
                      if (iVar6 != iVar7) {
                        iVar7 = xmlMemBlocks();
                        printf("Leak of %d blocks found in xmlNewEntity",
                               (ulong)(uint)(iVar7 - iVar6));
                        local_38 = local_38 + 1;
                        printf(" %d",(ulong)uVar19);
                        printf(" %d",(ulong)uVar22);
                        printf(" %d",(ulong)uVar18);
                        printf(" %d",(ulong)uVar1);
                        printf(" %d",(ulong)uVar17);
                        in_RSI = (xmlDocPtr)(ulong)uVar21;
                        printf(" %d");
                        putchar(10);
                      }
                    }
                  }
                }
              }
            }
          }
          function_tests = function_tests + 1;
          uVar19 = iVar4 + local_58 + local_54 + test_ret_1 + iVar2 + iVar3 + iVar5 + local_34 +
                   local_38;
          if (uVar19 != 0) {
            printf("Module entities: %d errors\n",(ulong)uVar19);
          }
          return uVar19;
        }
        bVar20 = true;
        while (iVar7 = (int)in_RSI, bVar20) {
          iVar6 = xmlMemBlocks();
          pxVar14 = gen_xmlBufferPtr(iVar3,iVar7);
          in_RSI = (xmlDocPtr)0x0;
          xmlDumpEntityDecl(pxVar14);
          call_tests = call_tests + 1;
          if (pxVar14 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar14);
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 == iVar7) break;
          iVar7 = xmlMemBlocks();
          bVar20 = false;
          printf("Leak of %d blocks found in xmlDumpEntityDecl",(ulong)(uint)(iVar7 - iVar6));
          test_ret_1 = test_ret_1 + 1;
          printf(" %d");
          in_RSI = (xmlDocPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        iVar3 = iVar3 + 1;
      } while( true );
    }
    bVar20 = true;
    while (iVar7 = (int)in_RSI, bVar20) {
      iVar6 = xmlMemBlocks();
      pxVar14 = gen_xmlBufferPtr(iVar3,iVar7);
      in_RSI = (xmlDocPtr)0x0;
      xmlDumpEntitiesTable(pxVar14);
      call_tests = call_tests + 1;
      if (pxVar14 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar14);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 == iVar7) break;
      iVar7 = xmlMemBlocks();
      bVar20 = false;
      printf("Leak of %d blocks found in xmlDumpEntitiesTable",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

static int
test_entities(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing entities : 13 of 17 functions ...\n");
    test_ret += test_xmlAddDocEntity();
    test_ret += test_xmlAddDtdEntity();
    test_ret += test_xmlCleanupPredefinedEntities();
    test_ret += test_xmlCopyEntitiesTable();
    test_ret += test_xmlCreateEntitiesTable();
    test_ret += test_xmlDumpEntitiesTable();
    test_ret += test_xmlDumpEntityDecl();
    test_ret += test_xmlEncodeEntitiesReentrant();
    test_ret += test_xmlEncodeSpecialChars();
    test_ret += test_xmlGetDocEntity();
    test_ret += test_xmlGetDtdEntity();
    test_ret += test_xmlGetParameterEntity();
    test_ret += test_xmlGetPredefinedEntity();
    test_ret += test_xmlInitializePredefinedEntities();
    test_ret += test_xmlNewEntity();

    if (test_ret != 0)
	printf("Module entities: %d errors\n", test_ret);
    return(test_ret);
}